

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChBody::GetContactPointSpeed
          (ChVector<double> *__return_storage_ptr__,ChBody *this,ChVector<double> *loc_point,
          ChState *state_x,ChStateDelta *state_w)

{
  ChVector<double> *v;
  ChVector<double> abs_omg;
  double local_b8;
  double dStack_b0;
  double local_a8;
  ChVector<double> abs_vel;
  ChVector<double> loc_omg;
  ChCoordsys<double> csys;
  
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&abs_omg,
             &state_x->super_ChVectorDynamic<double>,0,7);
  ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&csys,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&abs_omg,(type *)0x0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&abs_omg,
             &state_w->super_ChVectorDynamic<double>,0,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&abs_vel,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                       *)&abs_omg,(type *)0x0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&abs_omg,
             &state_w->super_ChVectorDynamic<double>,3,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&loc_omg,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                       *)&abs_omg,(type *)0x0);
  ChQuaternion<double>::Rotate(&csys.rot,&loc_omg);
  Vcross<double,double>(&abs_omg,loc_point);
  __return_storage_ptr__->m_data[0] = abs_vel.m_data[0] + local_b8;
  __return_storage_ptr__->m_data[1] = abs_vel.m_data[1] + dStack_b0;
  __return_storage_ptr__->m_data[2] = abs_vel.m_data[2] + local_a8;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChBody::GetContactPointSpeed(const ChVector<>& loc_point,
                                        const ChState& state_x,
                                        const ChStateDelta& state_w) {
    ChCoordsys<> csys(state_x.segment(0, 7));
    ChVector<> abs_vel(state_w.segment(0, 3));
    ChVector<> loc_omg(state_w.segment(3, 3));
    ChVector<> abs_omg = csys.TransformDirectionLocalToParent(loc_omg);

    return abs_vel + Vcross(abs_omg, loc_point);
}